

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_reporter.c
# Opt level: O2

void xml_reporter_start_suite(TestReporter *reporter,char *suitename,int count)

{
  long *plVar1;
  undefined8 uVar2;
  int iVar3;
  size_t sVar4;
  FILE *pFVar5;
  xmlDocPtr pxVar6;
  xmlNodePtr pxVar7;
  xmlChar *pxVar8;
  int *piVar9;
  char *pcVar10;
  long lVar11;
  int segment_decrementer;
  char filename [4096];
  
  segment_decrementer = reporter->breadcrumb->depth;
  lVar11 = (long)context_stack_p;
  if (99 < lVar11) {
    abort();
  }
  plVar1 = (long *)reporter->memo;
  context_stack_p = context_stack_p + 1;
  reporter->passes = 0;
  reporter->failures = 0;
  reporter->exceptions = 0;
  reporter->skips = 0;
  suite_path[0] = '\0';
  walk_breadcrumb(reporter->breadcrumb,strcat_path_segment,&segment_decrementer);
  if (suite_path[0] != '\0') {
    __strcat_chk(suite_path,"-",0x1000);
  }
  sVar4 = strlen(suite_path);
  __strncat_chk(suite_path,suitename,0xfff - sVar4,0x1000);
  iVar3 = __snprintf_chk(filename,0x1000,1,0x1000,"%s-%s.xml",file_prefix,suite_path);
  if (iVar3 < 0x1000) {
    if ((code *)*plVar1 == default_printer) {
      pFVar5 = fopen(filename,"w");
      uVar2 = _stderr;
      if (pFVar5 == (FILE *)0x0) {
        piVar9 = __errno_location();
        pcVar10 = strerror(*piVar9);
        __fprintf_chk(uVar2,1,"could not open %s: %s\r\n",filename,pcVar10);
        exit(1);
      }
      context_stack[lVar11].outFile = (FILE *)pFVar5;
    }
    context_stack[lVar11].suite_duration = 0;
    pxVar6 = (xmlDocPtr)xmlNewDoc("1.0");
    context_stack[lVar11].doc = pxVar6;
    pxVar7 = (xmlNodePtr)xmlNewNode(0,"testsuite");
    context_stack[lVar11].suite = pxVar7;
    pxVar8 = xmlEscapePropValue(suite_path);
    xmlNewProp(context_stack[lVar11].suite,"name",pxVar8);
    (*_xmlFree)(pxVar8);
    xmlDocSetRootElement(context_stack[lVar11].doc,context_stack[lVar11].suite);
    reporter_start_suite(reporter,suitename,0);
    return;
  }
  __fprintf_chk(_stderr,1,"filename truncated; exceeds PATH_MAX (= %d)\n",0x1000);
  exit(1);
}

Assistant:

static void xml_reporter_start_suite(TestReporter *reporter, const char *suitename, int count) {
    char filename[PATH_MAX];
    int segment_decrementer = reporter->breadcrumb->depth;
    XmlMemo *memo = (XmlMemo *)reporter->memo;
    FILE *out;

    (void)count;                /* UNUSED */

    reporter->passes = 0;
    reporter->failures = 0;
    reporter->skips = 0;
    reporter->exceptions = 0;

    suite_path[0] = '\0';
    walk_breadcrumb(reporter->breadcrumb, strcat_path_segment, &segment_decrementer);
    add_suite_name(suitename);

    if (snprintf(filename, sizeof(filename), "%s-%s.xml", file_prefix, suite_path) < 0)
        PANIC("Error when creating output filename");

    if (memo->printer == fprintf) {
        // If we're really printing to files, then open one...
        out = fopen(filename, "w");
        if (!out) {
            memo->printer(stderr, "could not open %s: %s\r\n", filename, strerror(errno));
            exit(EXIT_FAILURE);
        }
    } else
        out = stdout;

    file_stack[file_stack_p++] = out;
    memo->printer(out, "<?xml version=\"1.0\" encoding=\"ISO-8859-1\" ?>\n");
    memo->printer(out, indent(reporter));
    memo->printer(out, "<testsuite name=\"%s\">\n", suite_path);
    reporter_start_suite(reporter, suitename, 0);
}